

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

ON_UserData * __thiscall
ON_Object::TransferUserDataItem
          (ON_Object *this,ON_UserData *source_ud_copy_this,ON_UserData *source_ud_move_this,
          bool bPerformConflictCheck,UserDataConflictResolution userdata_conflict_resolution)

{
  bool bVar1;
  uint uVar2;
  ON_UnknownUserData *pOVar3;
  ON_UserData *p_00;
  bool bVar4;
  ON_UserData *local_68;
  ON_Object *p;
  bool bTransferSourceItem;
  bool bDeleteDestinationItem;
  ON_UserData *dest_ud;
  ON_UnknownUserData *uud;
  ON_UserData *source_ud;
  UserDataConflictResolution userdata_conflict_resolution_local;
  ON_UserData *pOStack_28;
  bool bPerformConflictCheck_local;
  ON_UserData *source_ud_move_this_local;
  ON_UserData *source_ud_copy_this_local;
  ON_Object *this_local;
  
  if (source_ud_move_this == (ON_UserData *)0x0) {
    if (source_ud_copy_this == (ON_UserData *)0x0) {
      return (ON_UserData *)0x0;
    }
    uud = (ON_UnknownUserData *)source_ud_copy_this;
    if (this == source_ud_copy_this->m_userdata_owner) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,0x5cb,"","source_ud_copy_this is already attached to this object.");
      return (ON_UserData *)0x0;
    }
  }
  else {
    if (source_ud_copy_this != (ON_UserData *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,0x5bd,"","At most one source_ud pointer can be not null.");
      return (ON_UserData *)0x0;
    }
    if ((source_ud_move_this->m_userdata_owner != (ON_Object *)0x0) ||
       (uud = (ON_UnknownUserData *)source_ud_move_this,
       source_ud_move_this->m_userdata_next != (ON_UserData *)0x0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,0x5c2,"","Cannot move userdata that is attached to another object.");
      return (ON_UserData *)0x0;
    }
  }
  bVar1 = ON_UserData::IsUnknownUserData(&uud->super_ON_UserData);
  if (((bVar1) &&
      (pOVar3 = ON_UnknownUserData::Cast((ON_Object *)uud), pOVar3 == (ON_UnknownUserData *)0x0)) &&
     (uVar2 = (**(code **)(lRam0000000000000000 + 0x30))(0,0), (uVar2 & 1) == 0)) {
    this_local = (ON_Object *)0x0;
  }
  else {
    if (bPerformConflictCheck) {
      local_68 = GetUserData(this,&(uud->super_ON_UserData).m_userdata_uuid);
    }
    else {
      local_68 = (ON_UserData *)0x0;
    }
    bVar1 = false;
    if (local_68 == (ON_UserData *)0x0) {
      bVar4 = true;
    }
    else {
      switch(userdata_conflict_resolution) {
      case destination_object:
        bVar4 = false;
        break;
      case source_object:
        bVar4 = true;
        break;
      case source_copycount_gt:
        bVar4 = local_68->m_userdata_copycount < (uud->super_ON_UserData).m_userdata_copycount;
        break;
      case source_copycount_ge:
        bVar4 = local_68->m_userdata_copycount <= (uud->super_ON_UserData).m_userdata_copycount;
        break;
      case destination_copycount_gt:
        bVar4 = (uud->super_ON_UserData).m_userdata_copycount < local_68->m_userdata_copycount;
        break;
      case destination_copycount_ge:
        bVar4 = (uud->super_ON_UserData).m_userdata_copycount <= local_68->m_userdata_copycount;
        break;
      case delete_item:
        bVar4 = false;
        bVar1 = true;
        break;
      default:
        bVar4 = false;
      }
    }
    if (bVar4) {
      pOStack_28 = source_ud_move_this;
      if (source_ud_copy_this != (ON_UserData *)0x0) {
        p_00 = ON_UserData::Duplicate(source_ud_copy_this);
        if (p_00 == (ON_UserData *)0x0) {
          return (ON_UserData *)0x0;
        }
        pOStack_28 = ON_UserData::Cast(&p_00->super_ON_Object);
        if (pOStack_28 == (ON_UserData *)0x0) {
          if (p_00 != (ON_UserData *)0x0) {
            (*(p_00->super_ON_Object)._vptr_ON_Object[4])();
          }
          return (ON_UserData *)0x0;
        }
        pOStack_28->m_userdata_owner = (ON_Object *)0x0;
      }
      if (pOStack_28 == (ON_UserData *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x62b,"","Bug in the code above.");
        this_local = (ON_Object *)0x0;
      }
      else {
        if ((local_68 != (ON_UserData *)0x0) && (local_68 != (ON_UserData *)0x0)) {
          (*(local_68->super_ON_Object)._vptr_ON_Object[4])();
        }
        pOStack_28->m_userdata_owner = this;
        pOStack_28->m_userdata_next = this->m_userdata_list;
        this->m_userdata_list = pOStack_28;
        this_local = &this->m_userdata_list->super_ON_Object;
      }
    }
    else {
      if (((bVar1) && (local_68 != (ON_UserData *)0x0)) && (local_68 != (ON_UserData *)0x0)) {
        (*(local_68->super_ON_Object)._vptr_ON_Object[4])();
      }
      this_local = (ON_Object *)0x0;
    }
  }
  return (ON_UserData *)this_local;
}

Assistant:

ON_UserData* ON_Object::TransferUserDataItem(
  const ON_UserData* source_ud_copy_this,
  ON_UserData* source_ud_move_this,
  bool bPerformConflictCheck,
  ON_Object::UserDataConflictResolution userdata_conflict_resolution
  )
{
  const ON_UserData* source_ud; // do not initialize so compiler will detect future bugs

  if (nullptr != source_ud_move_this)
  {
    if (nullptr != source_ud_copy_this)
    {
      ON_ERROR("At most one source_ud pointer can be not null.");
      return nullptr;
    }
    if (nullptr != source_ud_move_this->m_userdata_owner || nullptr != source_ud_move_this->m_userdata_next)
    {
      ON_ERROR("Cannot move userdata that is attached to another object.");
      return nullptr;
    }
    source_ud = source_ud_move_this;
  }
  else if ( nullptr != source_ud_copy_this )
  {
    if (this == source_ud_copy_this->m_userdata_owner)
    {
      ON_ERROR("source_ud_copy_this is already attached to this object.");
      return nullptr;
    }
    source_ud = source_ud_copy_this;
  }
  else
  {
    // nothing to do
    return nullptr;
  }

  if (source_ud->IsUnknownUserData())
  {
    // make sure we have valid user data - the first beta release of Rhino 2.0 
    // created empty user data.
    const ON_UnknownUserData* uud = ON_UnknownUserData::Cast(source_ud);
    if (nullptr == uud && false == uud->IsValid())
    {
      return nullptr;
    }
  }
  
  ON_UserData* dest_ud = bPerformConflictCheck ? GetUserData(source_ud->m_userdata_uuid) : nullptr;

  bool bDeleteDestinationItem = false;
  bool bTransferSourceItem; // no initialization
  if (nullptr == dest_ud)
  {
    bTransferSourceItem = true;
  }
  else
  {
    switch (userdata_conflict_resolution)
    {
    case ON_Object::UserDataConflictResolution::destination_object:
      bTransferSourceItem = false;
      break;

    case ON_Object::UserDataConflictResolution::source_object:
      bTransferSourceItem = true;
      break;

    case ON_Object::UserDataConflictResolution::source_copycount_gt:
      bTransferSourceItem = (source_ud->m_userdata_copycount > dest_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::source_copycount_ge:
      bTransferSourceItem =  (source_ud->m_userdata_copycount >= dest_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::destination_copycount_gt:
      bTransferSourceItem = (dest_ud->m_userdata_copycount > source_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::destination_copycount_ge:
      bTransferSourceItem =  (dest_ud->m_userdata_copycount >= source_ud->m_userdata_copycount);
      break;

    case ON_Object::UserDataConflictResolution::delete_item:
      bTransferSourceItem = false;
      bDeleteDestinationItem = true;
      break;

    default:
      bTransferSourceItem = false;
      break;
    }
  }

  if (false == bTransferSourceItem)
  {
    if (bDeleteDestinationItem && nullptr != dest_ud)
    {
      delete dest_ud;
    }
    return nullptr;
  }


  if (nullptr != source_ud_copy_this)
  {
    ON_Object* p = source_ud_copy_this->Duplicate();
    if ( nullptr == p )
      return nullptr;
    source_ud_move_this = ON_UserData::Cast(p);

    if (nullptr == source_ud_move_this)
    {
      delete p;
      return nullptr;
    }
    source_ud_move_this->m_userdata_owner = nullptr;
  }

  if (nullptr == source_ud_move_this)
  {
    ON_ERROR("Bug in the code above.");
    return nullptr;
  }

  if (nullptr != dest_ud)
  {
    delete dest_ud;
  }

  source_ud_move_this->m_userdata_owner = this;
  source_ud_move_this->m_userdata_next = m_userdata_list;
  m_userdata_list = source_ud_move_this;
  
  return m_userdata_list;
}